

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txfm_common_avx2.h
# Opt level: O3

void transpose_16bit_16x16_avx2(__m256i *in,__m256i *out)

{
  undefined1 auVar1 [32];
  __m256i alVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  bool bVar5;
  long lVar6;
  bool bVar7;
  undefined1 (*pauVar8) [32];
  long lVar9;
  undefined1 (*pauVar10) [32];
  __m256i t [16];
  undefined1 auStack_660 [32];
  longlong local_640;
  longlong lStack_638;
  longlong lStack_630;
  longlong lStack_628;
  longlong local_620;
  longlong lStack_618;
  longlong local_610;
  longlong lStack_608;
  longlong local_600;
  longlong lStack_5f8;
  longlong local_5f0;
  longlong lStack_5e8;
  longlong local_5e0;
  longlong lStack_5d8;
  longlong local_5d0;
  longlong lStack_5c8;
  longlong local_5c0;
  longlong lStack_5b8;
  longlong local_5b0;
  longlong lStack_5a8;
  longlong local_5a0;
  longlong lStack_598;
  longlong local_590;
  longlong lStack_588;
  longlong local_580;
  longlong lStack_578;
  longlong local_570;
  longlong lStack_568;
  longlong local_560;
  longlong lStack_558;
  longlong local_550;
  longlong lStack_548;
  longlong local_540;
  longlong lStack_538;
  longlong local_530;
  longlong lStack_528;
  longlong local_520;
  longlong lStack_518;
  longlong local_510;
  longlong lStack_508;
  longlong local_500;
  longlong lStack_4f8;
  longlong local_4f0;
  longlong lStack_4e8;
  longlong local_4e0;
  longlong lStack_4d8;
  longlong local_4d0;
  longlong lStack_4c8;
  longlong local_4c0;
  longlong lStack_4b8;
  longlong local_4b0;
  longlong lStack_4a8;
  longlong local_4a0;
  longlong lStack_498;
  longlong local_490;
  longlong lStack_488;
  longlong local_480;
  longlong lStack_478;
  longlong local_470;
  longlong lStack_468;
  longlong local_460;
  longlong lStack_458;
  longlong local_450;
  longlong lStack_448;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [64];
  undefined1 auStack_3c0 [32];
  undefined1 auStack_3a0 [32];
  undefined1 auStack_380 [288];
  undefined1 auStack_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 auStack_200 [64];
  undefined1 auStack_1c0 [64];
  undefined1 auStack_180 [376];
  
  lStack_630 = in[8][0];
  lStack_628 = in[8][1];
  local_640 = (*in)[0];
  lStack_638 = (*in)[1];
  local_610 = in[9][0];
  lStack_608 = in[9][1];
  local_620 = in[1][0];
  lStack_618 = in[1][1];
  local_5f0 = in[10][0];
  lStack_5e8 = in[10][1];
  local_600 = in[2][0];
  lStack_5f8 = in[2][1];
  local_5d0 = in[0xb][0];
  lStack_5c8 = in[0xb][1];
  local_5e0 = in[3][0];
  lStack_5d8 = in[3][1];
  local_5b0 = in[0xc][0];
  lStack_5a8 = in[0xc][1];
  local_5c0 = in[4][0];
  lStack_5b8 = in[4][1];
  local_590 = in[0xd][0];
  lStack_588 = in[0xd][1];
  local_5a0 = in[5][0];
  lStack_598 = in[5][1];
  local_570 = in[0xe][0];
  lStack_568 = in[0xe][1];
  local_580 = in[6][0];
  lStack_578 = in[6][1];
  local_550 = in[0xf][0];
  lStack_548 = in[0xf][1];
  local_560 = in[7][0];
  lStack_558 = in[7][1];
  local_530 = in[8][2];
  lStack_528 = in[8][3];
  local_540 = (*in)[2];
  lStack_538 = (*in)[3];
  local_510 = in[9][2];
  lStack_508 = in[9][3];
  local_520 = in[1][2];
  lStack_518 = in[1][3];
  local_4f0 = in[10][2];
  lStack_4e8 = in[10][3];
  local_500 = in[2][2];
  lStack_4f8 = in[2][3];
  local_4d0 = in[0xb][2];
  lStack_4c8 = in[0xb][3];
  local_4e0 = in[3][2];
  lStack_4d8 = in[3][3];
  local_4b0 = in[0xc][2];
  lStack_4a8 = in[0xc][3];
  local_4c0 = in[4][2];
  lStack_4b8 = in[4][3];
  local_490 = in[0xd][2];
  lStack_488 = in[0xd][3];
  local_4a0 = in[5][2];
  lStack_498 = in[5][3];
  local_470 = in[0xe][2];
  lStack_468 = in[0xe][3];
  local_480 = in[6][2];
  lStack_478 = in[6][3];
  local_450 = in[0xf][2];
  lStack_448 = in[0xf][3];
  local_460 = in[7][2];
  lStack_458 = in[7][3];
  lVar6 = 0x20;
  do {
    auVar4 = vpunpcklwd_avx2(*(undefined1 (*) [32])(auStack_660 + lVar6),
                             *(undefined1 (*) [32])((long)&local_640 + lVar6));
    *(undefined1 (*) [32])(auStack_260 + lVar6) = auVar4;
    auVar4 = vpunpckhwd_avx2(*(undefined1 (*) [32])(auStack_660 + lVar6),
                             *(undefined1 (*) [32])((long)&local_640 + lVar6));
    *(undefined1 (*) [32])(local_240 + lVar6) = auVar4;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x120);
  lVar6 = 0;
  pauVar8 = &local_440;
  pauVar10 = &local_240;
  bVar5 = true;
  do {
    bVar7 = bVar5;
    auVar4 = *pauVar10;
    lVar6 = lVar6 * 0x20;
    auVar1 = *(undefined1 (*) [32])(auStack_200 + lVar6);
    auVar3 = vunpcklps_avx(auVar4,auVar1);
    *pauVar8 = auVar3;
    auVar4 = vunpckhps_avx(auVar4,auVar1);
    *(undefined1 (*) [32])(local_400 + lVar6) = auVar4;
    auVar4 = vpunpckldq_avx2(*(undefined1 (*) [32])(auStack_1c0 + lVar6),
                             *(undefined1 (*) [32])(auStack_180 + lVar6));
    *(undefined1 (*) [32])(auStack_3c0 + lVar6) = auVar4;
    auVar4 = vpunpckhdq_avx2(*(undefined1 (*) [32])(auStack_1c0 + lVar6),
                             *(undefined1 (*) [32])(auStack_180 + lVar6));
    *(undefined1 (*) [32])(auStack_380 + lVar6) = auVar4;
    lVar6 = 1;
    pauVar8 = &local_420;
    pauVar10 = &local_220;
    bVar5 = false;
  } while (bVar7);
  lVar6 = 0;
  pauVar8 = &local_440;
  bVar5 = true;
  do {
    bVar7 = bVar5;
    auVar4 = *pauVar8;
    lVar9 = lVar6 * 0x20;
    auVar1 = *(undefined1 (*) [32])(auStack_3c0 + lVar9);
    alVar2 = (__m256i)vunpcklpd_avx(auVar4,auVar1);
    out[lVar6] = alVar2;
    alVar2 = (__m256i)vunpckhpd_avx(auVar4,auVar1);
    out[lVar6 + 1] = alVar2;
    auVar4 = *(undefined1 (*) [32])(local_420 + lVar9);
    auVar1 = *(undefined1 (*) [32])(auStack_3a0 + lVar9);
    alVar2 = (__m256i)vpunpcklqdq_avx2(auVar4,auVar1);
    out[lVar6 + 4] = alVar2;
    alVar2 = (__m256i)vpunpckhqdq_avx2(auVar4,auVar1);
    out[lVar6 + 5] = alVar2;
    lVar6 = 2;
    pauVar8 = (undefined1 (*) [32])local_400;
    bVar5 = false;
  } while (bVar7);
  lVar6 = 0x20;
  do {
    auVar4 = vpunpcklwd_avx2(*(undefined1 (*) [32])((long)&local_560 + lVar6),
                             *(undefined1 (*) [32])((long)&local_540 + lVar6));
    *(undefined1 (*) [32])(auStack_260 + lVar6) = auVar4;
    auVar4 = vpunpckhwd_avx2(*(undefined1 (*) [32])((long)&local_560 + lVar6),
                             *(undefined1 (*) [32])((long)&local_540 + lVar6));
    *(undefined1 (*) [32])(local_240 + lVar6) = auVar4;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x120);
  lVar6 = 0;
  pauVar8 = &local_440;
  pauVar10 = &local_240;
  bVar5 = true;
  do {
    bVar7 = bVar5;
    auVar4 = *pauVar10;
    lVar6 = lVar6 * 0x20;
    auVar1 = *(undefined1 (*) [32])(auStack_200 + lVar6);
    auVar3 = vunpcklps_avx(auVar4,auVar1);
    *pauVar8 = auVar3;
    auVar4 = vunpckhps_avx(auVar4,auVar1);
    *(undefined1 (*) [32])(local_400 + lVar6) = auVar4;
    auVar4 = vpunpckldq_avx2(*(undefined1 (*) [32])(auStack_1c0 + lVar6),
                             *(undefined1 (*) [32])(auStack_180 + lVar6));
    *(undefined1 (*) [32])(auStack_3c0 + lVar6) = auVar4;
    auVar4 = vpunpckhdq_avx2(*(undefined1 (*) [32])(auStack_1c0 + lVar6),
                             *(undefined1 (*) [32])(auStack_180 + lVar6));
    *(undefined1 (*) [32])(auStack_380 + lVar6) = auVar4;
    lVar6 = 1;
    pauVar8 = &local_420;
    pauVar10 = &local_220;
    bVar5 = false;
  } while (bVar7);
  lVar6 = 0;
  pauVar8 = &local_440;
  bVar5 = true;
  do {
    bVar7 = bVar5;
    auVar4 = *pauVar8;
    lVar9 = lVar6 * 0x20;
    auVar1 = *(undefined1 (*) [32])(auStack_3c0 + lVar9);
    alVar2 = (__m256i)vunpcklpd_avx(auVar4,auVar1);
    out[lVar6 + 8] = alVar2;
    alVar2 = (__m256i)vunpckhpd_avx(auVar4,auVar1);
    out[lVar6 + 9] = alVar2;
    auVar4 = *(undefined1 (*) [32])(local_420 + lVar9);
    auVar1 = *(undefined1 (*) [32])(auStack_3a0 + lVar9);
    alVar2 = (__m256i)vpunpcklqdq_avx2(auVar4,auVar1);
    out[lVar6 + 0xc] = alVar2;
    alVar2 = (__m256i)vpunpckhqdq_avx2(auVar4,auVar1);
    out[lVar6 + 0xd] = alVar2;
    lVar6 = 2;
    pauVar8 = (undefined1 (*) [32])local_400;
    bVar5 = false;
  } while (bVar7);
  return;
}

Assistant:

static inline void transpose_16bit_16x16_avx2(const __m256i *const in,
                                              __m256i *const out) {
  __m256i t[16];

#define LOADL(idx)                                                            \
  t[idx] = _mm256_castsi128_si256(_mm_load_si128((__m128i const *)&in[idx])); \
  t[idx] = _mm256_inserti128_si256(                                           \
      t[idx], _mm_load_si128((__m128i const *)&in[idx + 8]), 1);

#define LOADR(idx)                                                           \
  t[8 + idx] =                                                               \
      _mm256_castsi128_si256(_mm_load_si128((__m128i const *)&in[idx] + 1)); \
  t[8 + idx] = _mm256_inserti128_si256(                                      \
      t[8 + idx], _mm_load_si128((__m128i const *)&in[idx + 8] + 1), 1);

  // load left 8x16
  LOADL(0)
  LOADL(1)
  LOADL(2)
  LOADL(3)
  LOADL(4)
  LOADL(5)
  LOADL(6)
  LOADL(7)

  // load right 8x16
  LOADR(0)
  LOADR(1)
  LOADR(2)
  LOADR(3)
  LOADR(4)
  LOADR(5)
  LOADR(6)
  LOADR(7)

  // get the top 16x8 result
  transpose2_8x8_avx2(t, out);
  // get the bottom 16x8 result
  transpose2_8x8_avx2(&t[8], &out[8]);
}